

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::SizeAtCapacity(RepeatedPtrFieldBase *this)

{
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  Nonnull<const_char_*> pcVar4;
  long v2;
  
  iVar1 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar3 = rep(this);
    uVar2 = pRVar3->allocated_size;
  }
  if ((int)uVar2 < iVar1) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar1,(long)(int)uVar2,"size() <= allocated_size()");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      uVar2 = (uint)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar3 = rep(this);
      uVar2 = pRVar3->allocated_size;
    }
    v2 = (long)this->capacity_proxy_ + 1;
    if ((int)v2 < (int)uVar2) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)(int)uVar2,v2,"allocated_size() <= Capacity()");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      return this->capacity_proxy_ < this->current_size_;
    }
  }
  else {
    SizeAtCapacity();
  }
  SizeAtCapacity();
}

Assistant:

inline bool SizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This is equivalent to `current_size_ == Capacity()`.
    // Assuming `Capacity()` function is inlined, compiler is likely to optimize
    // away "+ kSSOCapacity" and reduce it to "current_size_ > capacity_proxy_"
    // which is an instruction less than "current_size_ == capacity_proxy_ + 1".
    return current_size_ >= Capacity();
  }